

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O0

TestSuite * messaging_tests(void)

{
  TestSuite *pTVar1;
  TestSuite *pTVar2;
  TestSuite *suite;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("messaging_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
                      ,0x42);
  pTVar2 = highly_nested_test_suite();
  add_suite_(pTVar1,"highly_nested_test_suite()",pTVar2);
  add_test_(pTVar1,"can_send_message",&CgreenSpec__default__can_send_message__);
  add_test_(pTVar1,"failure_reported_and_exception_thrown_when_messaging_would_block",
            &CgreenSpec__default__failure_reported_and_exception_thrown_when_messaging_would_block__
           );
  return pTVar1;
}

Assistant:

TestSuite *messaging_tests(void) {
    TestSuite *suite = create_test_suite();
    add_suite(suite, highly_nested_test_suite());
    add_test(suite, can_send_message);
#ifndef WIN32 // TODO: win32 needs non-blocking pipes like posix for this to pass
    add_test(suite, failure_reported_and_exception_thrown_when_messaging_would_block);
#endif
    return suite;
}